

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O2

void __thiscall http::Request::Request(Request *this,string *url,InternetProtocol protocol)

{
  string *this_00;
  string *this_01;
  long lVar1;
  string local_50 [32];
  
  this->internetProtocol = protocol;
  (this->scheme)._M_dataplus._M_p = (pointer)&(this->scheme).field_2;
  (this->scheme)._M_string_length = 0;
  (this->scheme).field_2._M_local_buf[0] = '\0';
  (this->domain)._M_dataplus._M_p = (pointer)&(this->domain).field_2;
  (this->domain)._M_string_length = 0;
  this_00 = &this->domain;
  (this->domain).field_2._M_local_buf[0] = '\0';
  (this->port)._M_dataplus._M_p = (pointer)&(this->port).field_2;
  (this->port)._M_string_length = 0;
  (this->port).field_2._M_local_buf[0] = '\0';
  this_01 = &this->path;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  lVar1 = std::__cxx11::string::find((char *)url,0x162213);
  if (lVar1 == -1) {
    std::__cxx11::string::assign((char *)&this->scheme);
    std::__cxx11::string::_M_assign((string *)this_01);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)url);
    std::__cxx11::string::operator=((string *)&this->scheme,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_50,(ulong)url);
    std::__cxx11::string::operator=((string *)this_01,local_50);
    std::__cxx11::string::~string(local_50);
  }
  lVar1 = std::__cxx11::string::find((char)this_01,0x23);
  if (lVar1 != -1) {
    std::__cxx11::string::resize((ulong)this_01);
  }
  lVar1 = std::__cxx11::string::find((char)this_01,0x2f);
  if (lVar1 == -1) {
    std::__cxx11::string::_M_assign((string *)this_00);
    std::__cxx11::string::assign((char *)this_01);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_01);
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_01);
    std::__cxx11::string::operator=((string *)this_01,local_50);
    std::__cxx11::string::~string(local_50);
  }
  lVar1 = std::__cxx11::string::find((char)this_00,0x3a);
  if (lVar1 == -1) {
    std::__cxx11::string::assign((char *)&this->port);
  }
  else {
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
    std::__cxx11::string::operator=((string *)&this->port,local_50);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::resize((ulong)this_00);
  }
  return;
}

Assistant:

explicit Request(const std::string& url,
                         InternetProtocol protocol = InternetProtocol::V4):
            internetProtocol(protocol)
        {
            const auto schemeEndPosition = url.find("://");

            if (schemeEndPosition != std::string::npos)
            {
                scheme = url.substr(0, schemeEndPosition);
                path = url.substr(schemeEndPosition + 3);
            }
            else
            {
                scheme = "http";
                path = url;
            }

            const auto fragmentPosition = path.find('#');

            // remove the fragment part
            if (fragmentPosition != std::string::npos)
                path.resize(fragmentPosition);

            const auto pathPosition = path.find('/');

            if (pathPosition == std::string::npos)
            {
                domain = path;
                path = "/";
            }
            else
            {
                domain = path.substr(0, pathPosition);
                path = path.substr(pathPosition);
            }

            const auto portPosition = domain.find(':');

            if (portPosition != std::string::npos)
            {
                port = domain.substr(portPosition + 1);
                domain.resize(portPosition);
            }
            else
                port = "80";
        }